

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxcox.c
# Opt level: O3

double boxcox(double *x,int N,double *lambda,double *y)

{
  checkConstant(x,N);
  puts("Input is a constant vector. Exiting. ");
  exit(-1);
}

Assistant:

double boxcox(double *x, int N,double *lambda,double *y) {
    double *params;
    double lmbd,a,b;
    int cc,cn;

    // Check if x has all constant values
    cc = checkConstant(x,N);

    if (cc == 1) {
        printf("Input is a constant vector. Exiting. \n");
        exit(-1);
    }

    // Check for negative values

    if (cn == 1) {
        printf("Input vector cannot have negative values. Exiting. \n");
        exit(-1);
    }

    params = (double*) malloc(sizeof(double)*(N+1));

    params[0] = (double) N;
    memcpy(params+1,x,sizeof(double)*N);

    custom_funcuni boxcox_mle = {boxcox_loglik,params};

    if (lambda == NULL) {
        a = -2;
        b = 2;
        lmbd = fminbnd(&boxcox_mle,a,b);
    } else {
        lmbd = *lambda;
    }

    boxcox_eval(x,N,lmbd,y);

    free(params);
    return lmbd;
}